

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsItemPrivate::combineTransformToParent
          (QGraphicsItemPrivate *this,QTransform *x,QTransform *viewTransform)

{
  double dVar1;
  double dVar2;
  long lVar3;
  QTransform *pQVar4;
  long in_FS_OFFSET;
  byte bVar5;
  QTransform local_70;
  long local_20;
  
  bVar5 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((viewTransform == (QTransform *)0x0) || ((*(uint *)&this->field_0x161 & 0x20000400) == 0)) {
    if (this->transformData != (TransformData *)0x0) {
      TransformData::computedFullTransform(&local_70,this->transformData,(QTransform *)0x0);
      QTransform::operator*=(x,&local_70);
    }
    dVar1 = (this->pos).xp;
    dVar2 = (this->pos).yp;
    if ((((dVar1 != 0.0) || (NAN(dVar1))) || (dVar2 != 0.0)) || (NAN(dVar2))) {
      QTransform::fromTranslate(dVar1,dVar2);
      QTransform::operator*=(x,&local_70);
    }
  }
  else {
    QGraphicsItem::deviceTransform(&local_70,this->q_ptr,viewTransform);
    pQVar4 = &local_70;
    for (lVar3 = 0x4a; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined1 *)x->m_matrix[0] = *(undefined1 *)pQVar4->m_matrix[0];
      pQVar4 = (QTransform *)((long)pQVar4 + (ulong)bVar5 * -2 + 1);
      x = (QTransform *)((long)x + (ulong)bVar5 * -2 + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::combineTransformToParent(QTransform *x, const QTransform *viewTransform) const
{
    // COMBINE
    if (viewTransform && itemIsUntransformable()) {
        *x = q_ptr->deviceTransform(*viewTransform);
    } else {
        if (transformData)
            *x *= transformData->computedFullTransform();
        if (!pos.isNull())
            *x *= QTransform::fromTranslate(pos.x(), pos.y());
    }
}